

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_ReallocNonAllocatedMemory_TestShell::
~TEST_MemoryLeakDetectorTest_ReallocNonAllocatedMemory_TestShell
          (TEST_MemoryLeakDetectorTest_ReallocNonAllocatedMemory_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, ReallocNonAllocatedMemory)
{
    char mem1;
    char* mem2 = detector->reallocMemory(testAllocator, &mem1, 5, "other.cpp", 13, true);
    detector->deallocMemory(testAllocator, mem2, true);
    detector->stopChecking();
    CHECK(reporter->message->contains("Deallocating non-allocated memory\n"));
    CHECK(reporter->message->contains("   deallocated at file: other.cpp line: 13"));
}